

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRConstant *c;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  bool bVar6;
  string name;
  LoopLock local_e0;
  string local_d8;
  size_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b8 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_e0);
  }
  else {
    pTVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar5 + sVar2;
    bVar6 = false;
    do {
      while( true ) {
        pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if ((pVVar3[pTVar5->id].type == TypeConstant) &&
           (c = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + pTVar5->id),
           c->specialization == false)) break;
LAB_0028a6bd:
        pTVar5 = pTVar5 + 1;
        if (pTVar5 == pTVar1) {
          ParsedIR::LoopLock::~LoopLock(&local_e0);
          if (!bVar6) {
            return;
          }
          goto LAB_0028a819;
        }
      }
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(c->super_IVariant).field_0xc);
      bVar4 = Compiler::is_array((Compiler *)this,type);
      if ((!bVar4) ||
         (((local_b8 == 1 && (bVar4 = Compiler::is_scalar((Compiler *)this,type), !bVar4)) &&
          (bVar4 = Compiler::is_vector((Compiler *)this,type), !bVar4)))) goto LAB_0028a6bd;
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(c->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_50,this,(ulong)(c->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_70,this,type);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8.field_2._M_allocated_capacity = 0x746e6174736e6f63;
      local_d8._M_string_length = 8;
      local_d8.field_2._M_local_buf[8] = '\0';
      inject_top_level_storage_qualifier(&local_b0,&local_70,&local_d8);
      CompilerGLSL::constant_expression_abi_cxx11_
                (&local_90,&this->super_CompilerGLSL,c,false,false);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_b0,(char (*) [4])0x3fb085,&local_90,
                 (char (*) [2])0x405f81);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pTVar5 = pTVar5 + 1;
      bVar6 = true;
    } while (pTVar5 != pTVar1);
    ParsedIR::LoopLock::~LoopLock(&local_e0);
LAB_0028a819:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
  }
  return;
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (is_array(type) && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement(inject_top_level_storage_qualifier(variable_decl(type, name), "constant"),
			          " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}